

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

Vector3f operator*(Matrix3f *m,Vector3f *v)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  Vector3f *in_RDX;
  float *pfVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  Vector3f VVar8;
  
  Vector3f::Vector3f((Vector3f *)m,0.0,0.0,0.0);
  lVar6 = 0;
  do {
    lVar7 = 0;
    pfVar5 = v->m_elements;
    do {
      fVar1 = *pfVar5;
      pfVar4 = Vector3f::operator[](in_RDX,(int)lVar7);
      fVar2 = *pfVar4;
      pfVar4 = Vector3f::operator[]((Vector3f *)m,(int)lVar6);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4));
      VVar8.m_elements[2] = auVar3._0_4_;
      *pfVar4 = VVar8.m_elements[2];
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + 3;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    v = (Vector3f *)((long)v + 4);
  } while (lVar6 != 3);
  VVar8.m_elements[1] = 0.0;
  VVar8.m_elements[0] = fVar1;
  return (Vector3f)VVar8.m_elements;
}

Assistant:

Vector3f operator * ( const Matrix3f& m, const Vector3f& v )
{
	Vector3f output( 0, 0, 0 );

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}